

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zealot.c
# Opt level: O2

int get_bv_stage(CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA *pAVar3;
  
  bVar1 = is_affected(ch,(int)gsn_burning_vision);
  if (bVar1) {
    pAVar3 = (AFFECT_DATA *)&ch->affected;
    do {
      pAVar3 = pAVar3->next;
      if (pAVar3 == (AFFECT_DATA *)0x0) break;
    } while (pAVar3->type != gsn_burning_vision);
    iVar2 = (0x14 - pAVar3->duration) / (int)pAVar3->modifier;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int get_bv_stage(CHAR_DATA *ch)
{
	AFFECT_DATA *af;

	if (!is_affected(ch, gsn_burning_vision) /*|| is_immortal(ch)*/)
		return -1;

	for (af = ch->affected; af != nullptr; af = af->next)
	{
		if (af->type == gsn_burning_vision)
			break;
	}

	return ((20 - af->duration) / af->modifier);
}